

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_pippenger_wnaf
              (secp256k1_gej *buckets,int bucket_window,secp256k1_pippenger_state *state,
              secp256k1_gej *r,secp256k1_scalar *sc,secp256k1_ge *pt,size_t num)

{
  int iVar1;
  long lVar2;
  long *in_RDX;
  int in_ESI;
  int skew;
  int idx;
  secp256k1_ge tmp;
  secp256k1_pippenger_point_state point_state;
  secp256k1_gej *in_stack_00000080;
  int n;
  secp256k1_gej running_sum;
  int j;
  int i;
  size_t no;
  size_t np;
  size_t n_wnaf;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  secp256k1_gej *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffedc;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  int local_108;
  int local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  
  local_54 = (int)(0x7f / (long)(in_ESI + 1)) + 1;
  lVar2 = (long)local_54;
  local_50 = 0;
  local_108 = in_stack_fffffffffffffe88;
  for (local_48 = 0; local_48 < tmp.x.n[0]; local_48 = local_48 + 1) {
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x1472a7);
    if ((iVar1 == 0) && (iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1472c5), iVar1 == 0)) {
      *(ulong *)(in_RDX[1] + local_50 * 0x10 + 8) = local_48;
      iVar1 = secp256k1_wnaf_fixed
                        (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffedc);
      *(int *)(in_RDX[1] + local_50 * 0x10) = iVar1;
      local_50 = local_50 + 1;
    }
  }
  secp256k1_gej_set_infinity((secp256k1_gej *)0x147398);
  if (local_50 != 0) {
    while (local_54 = local_54 + -1, -1 < local_54) {
      for (local_58 = 0; (long)local_58 < 1L << ((byte)in_ESI & 0x3f); local_58 = local_58 + 1) {
        secp256k1_gej_set_infinity((secp256k1_gej *)0x147425);
      }
      for (local_48 = 0; local_48 < local_50; local_48 = local_48 + 1) {
        iVar1 = *(int *)(*in_RDX + (local_48 * lVar2 + (long)local_54) * 4);
        if ((local_54 == 0) &&
           (local_108 = (int)*(undefined8 *)(in_RDX[1] + local_48 * 0x10), local_108 != 0)) {
          secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffe90,
                           (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe8c,local_108));
          secp256k1_gej_add_ge_var
                    (in_stack_00000080,(secp256k1_gej *)point_state.input_pos,
                     (secp256k1_ge *)point_state._0_8_,(secp256k1_fe *)tmp._96_8_);
        }
        if (iVar1 < 1) {
          if (iVar1 < 0) {
            in_stack_fffffffffffffe8c = -(iVar1 + 1) / 2;
            secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffe90,
                             (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe8c,local_108));
            secp256k1_gej_add_ge_var
                      (in_stack_00000080,(secp256k1_gej *)point_state.input_pos,
                       (secp256k1_ge *)point_state._0_8_,(secp256k1_fe *)tmp._96_8_);
          }
        }
        else {
          in_stack_fffffffffffffe8c = (iVar1 + -1) / 2;
          secp256k1_gej_add_ge_var
                    (in_stack_00000080,(secp256k1_gej *)point_state.input_pos,
                     (secp256k1_ge *)point_state._0_8_,(secp256k1_fe *)tmp._96_8_);
        }
      }
      for (local_58 = 0; local_58 < in_ESI; local_58 = local_58 + 1) {
        secp256k1_gej_double_var
                  (in_stack_fffffffffffffe90,
                   (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffe8c,local_108),
                   (secp256k1_fe *)0x14763f);
      }
      secp256k1_gej_set_infinity((secp256k1_gej *)0x14765f);
      local_58 = (int)(1L << ((byte)in_ESI & 0x3f));
      while (local_58 = local_58 + -1, 0 < local_58) {
        secp256k1_gej_add_var
                  ((secp256k1_gej *)running_sum.x._40_8_,(secp256k1_gej *)running_sum.x.n[4],
                   (secp256k1_gej *)running_sum.x.n[3],(secp256k1_fe *)running_sum.x.n[2]);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)running_sum.x._40_8_,(secp256k1_gej *)running_sum.x.n[4],
                   (secp256k1_gej *)running_sum.x.n[3],(secp256k1_fe *)running_sum.x.n[2]);
      }
      secp256k1_gej_add_var
                ((secp256k1_gej *)running_sum.x._40_8_,(secp256k1_gej *)running_sum.x.n[4],
                 (secp256k1_gej *)running_sum.x.n[3],(secp256k1_fe *)running_sum.x.n[2]);
      secp256k1_gej_double_var
                (in_stack_fffffffffffffe90,
                 (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffe8c,local_108),
                 (secp256k1_fe *)0x147724);
      secp256k1_gej_add_var
                ((secp256k1_gej *)running_sum.x._40_8_,(secp256k1_gej *)running_sum.x.n[4],
                 (secp256k1_gej *)running_sum.x.n[3],(secp256k1_fe *)running_sum.x.n[2]);
    }
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_pippenger_wnaf(secp256k1_gej *buckets, int bucket_window, struct secp256k1_pippenger_state *state, secp256k1_gej *r, const secp256k1_scalar *sc, const secp256k1_ge *pt, size_t num) {
    size_t n_wnaf = WNAF_SIZE(bucket_window+1);
    size_t np;
    size_t no = 0;
    int i;
    int j;

    for (np = 0; np < num; ++np) {
        if (secp256k1_scalar_is_zero(&sc[np]) || secp256k1_ge_is_infinity(&pt[np])) {
            continue;
        }
        state->ps[no].input_pos = np;
        state->ps[no].skew_na = secp256k1_wnaf_fixed(&state->wnaf_na[no*n_wnaf], &sc[np], bucket_window+1);
        no++;
    }
    secp256k1_gej_set_infinity(r);

    if (no == 0) {
        return 1;
    }

    for (i = n_wnaf - 1; i >= 0; i--) {
        secp256k1_gej running_sum;

        for(j = 0; j < ECMULT_TABLE_SIZE(bucket_window+2); j++) {
            secp256k1_gej_set_infinity(&buckets[j]);
        }

        for (np = 0; np < no; ++np) {
            int n = state->wnaf_na[np*n_wnaf + i];
            struct secp256k1_pippenger_point_state point_state = state->ps[np];
            secp256k1_ge tmp;
            int idx;

            if (i == 0) {
                /* correct for wnaf skew */
                int skew = point_state.skew_na;
                if (skew) {
                    secp256k1_ge_neg(&tmp, &pt[point_state.input_pos]);
                    secp256k1_gej_add_ge_var(&buckets[0], &buckets[0], &tmp, NULL);
                }
            }
            if (n > 0) {
                idx = (n - 1)/2;
                secp256k1_gej_add_ge_var(&buckets[idx], &buckets[idx], &pt[point_state.input_pos], NULL);
            } else if (n < 0) {
                idx = -(n + 1)/2;
                secp256k1_ge_neg(&tmp, &pt[point_state.input_pos]);
                secp256k1_gej_add_ge_var(&buckets[idx], &buckets[idx], &tmp, NULL);
            }
        }

        for(j = 0; j < bucket_window; j++) {
            secp256k1_gej_double_var(r, r, NULL);
        }

        secp256k1_gej_set_infinity(&running_sum);
        /* Accumulate the sum: bucket[0] + 3*bucket[1] + 5*bucket[2] + 7*bucket[3] + ...
         *                   = bucket[0] +   bucket[1] +   bucket[2] +   bucket[3] + ...
         *                   +         2 *  (bucket[1] + 2*bucket[2] + 3*bucket[3] + ...)
         * using an intermediate running sum:
         * running_sum = bucket[0] +   bucket[1] +   bucket[2] + ...
         *
         * The doubling is done implicitly by deferring the final window doubling (of 'r').
         */
        for(j = ECMULT_TABLE_SIZE(bucket_window+2) - 1; j > 0; j--) {
            secp256k1_gej_add_var(&running_sum, &running_sum, &buckets[j], NULL);
            secp256k1_gej_add_var(r, r, &running_sum, NULL);
        }

        secp256k1_gej_add_var(&running_sum, &running_sum, &buckets[0], NULL);
        secp256k1_gej_double_var(r, r, NULL);
        secp256k1_gej_add_var(r, r, &running_sum, NULL);
    }
    return 1;
}